

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_i_refvec.h
# Opt level: O0

void __thiscall TNT::i_refvec<interval>::i_refvec(i_refvec<interval> *this,int n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  interval *piVar4;
  int *piVar5;
  interval *local_50;
  int n_local;
  i_refvec<interval> *this_local;
  
  this->data_ = (interval *)0x0;
  this->ref_count_ = (int *)0x0;
  if (0 < n) {
    uVar2 = (ulong)n;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x18),0);
    if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    piVar4 = (interval *)operator_new__(uVar3);
    if (uVar2 != 0) {
      local_50 = piVar4;
      do {
        interval::interval(local_50);
        local_50 = local_50 + 1;
      } while (local_50 != piVar4 + uVar2);
    }
    this->data_ = piVar4;
    piVar5 = (int *)operator_new(4);
    this->ref_count_ = piVar5;
    *this->ref_count_ = 1;
  }
  return;
}

Assistant:

i_refvec<T>::i_refvec(int n) : data_(NULL), ref_count_(NULL)
{
	if (n >= 1)
	{
#ifdef TNT_DEBUG
		std::cout  << "new data storage.\n";
#endif
		data_ = new T[n];
		ref_count_ = new int;
		*ref_count_ = 1;
	}
}